

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O0

Ptr<DescriptorSetLayout>
myvk::DescriptorSetLayout::Create
          (Ptr<Device> *device,
          vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
          *bindings)

{
  PFN_vkCreateDescriptorSetLayout p_Var1;
  VkResult VVar2;
  size_type sVar3;
  element_type *this;
  VkDevice pVVar4;
  element_type *peVar5;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<DescriptorSetLayout> PVar6;
  VkDescriptorSetLayoutCreateInfo info;
  shared_ptr<myvk::DescriptorSetLayout> ret;
  shared_ptr<myvk::DescriptorSetLayout> *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  VkDescriptorSetLayoutCreateInfo local_48;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *local_18;
  
  local_18 = in_RDX;
  std::make_shared<myvk::DescriptorSetLayout>();
  std::__shared_ptr_access<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2d71d2);
  std::shared_ptr<myvk::Device>::operator=
            ((shared_ptr<myvk::Device> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (shared_ptr<myvk::Device> *)in_stack_ffffffffffffff68);
  local_48.flags = 0;
  local_48.bindingCount = 0;
  local_48.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_48._4_4_ = 0;
  sVar3 = std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
          size(local_18);
  local_48.bindingCount = (uint32_t)sVar3;
  local_48.pBindings =
       std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
       data((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
            0x2d7216);
  p_Var1 = vkCreateDescriptorSetLayout;
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2d7237);
  pVVar4 = Device::GetHandle(this);
  peVar5 = std::
           __shared_ptr_access<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2d7250);
  VVar2 = (*p_Var1)(pVVar4,&local_48,(VkAllocationCallbacks *)0x0,&peVar5->m_descriptor_set_layout);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)(ulong)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  }
  else {
    std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)CONCAT44(VVar2,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x2d72cc);
  PVar6.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar6.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<DescriptorSetLayout>)
         PVar6.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<DescriptorSetLayout> DescriptorSetLayout::Create(const Ptr<Device> &device,
                                                     const std::vector<VkDescriptorSetLayoutBinding> &bindings) {
	auto ret = std::make_shared<DescriptorSetLayout>();
	ret->m_device_ptr = device;

	VkDescriptorSetLayoutCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
	info.bindingCount = bindings.size();
	info.pBindings = bindings.data();

	if (vkCreateDescriptorSetLayout(device->GetHandle(), &info, nullptr, &ret->m_descriptor_set_layout) != VK_SUCCESS)
		return nullptr;

	return ret;
}